

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

uint32 __thiscall Clasp::Solver::analyzeConflict(Solver *this)

{
  pointer pDVar1;
  uint uVar2;
  size_type sVar3;
  pointer puVar4;
  pointer pLVar5;
  pointer puVar6;
  pointer pAVar7;
  uint32 uVar8;
  ClauseHead *rhs_00;
  ulong uVar9;
  long *plVar10;
  Antecedent AVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  Literal p;
  Antecedent lhs;
  Antecedent rhs;
  Literal local_7c;
  Antecedent local_78;
  Antecedent local_70;
  int local_64;
  long *local_60;
  LitVec *local_58;
  LitVec *local_50;
  pair<Clasp::Literal,_int> local_48;
  SolverStrategies local_40;
  long *local_38;
  
  plVar10 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe);
  (**(code **)(*plVar10 + 0x40))
            (plVar10,this,
             *(uint *)((this->levels_).super_type.ebo_.buf +
                      ((this->levels_).super_type.ebo_.size - 1)) & 0x3fffffff);
  local_78.data_ = (uint64)&local_7c;
  local_7c.rep_ = 0;
  local_50 = &this->cc_;
  (this->cc_).ebo_.size = 0;
  bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>::
  insert_impl<unsigned_int,bk_lib::detail::Fill<Clasp::Literal>>
            ((pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>> *)local_50,
             (this->cc_).ebo_.buf,1,(Fill<Clasp::Literal> *)&local_78);
  local_78.data_ = 0;
  local_70.data_ = 0;
  local_40 = this->strategy_;
  local_60 = (long *)0x0;
  (this->bumpAct_).ebo_.size = 0;
  local_58 = &this->conflict_;
  iVar15 = 0;
  iVar12 = 0;
  while( true ) {
    plVar10 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe);
    local_38 = local_60;
    (**(code **)(*plVar10 + 0x50))(plVar10,this,local_58,local_7c.rep_);
    local_64 = iVar15;
    if ((this->conflict_).ebo_.size == 0) {
      iVar14 = 0;
    }
    else {
      iVar14 = 0;
      uVar9 = 0;
      do {
        puVar4 = (this->assign_).assign_.ebo_.buf;
        pLVar5 = (this->conflict_).ebo_.buf;
        uVar13 = pLVar5[uVar9].rep_;
        uVar2 = *(uint *)((long)puVar4 + (ulong)(uVar13 & 0xfffffffc));
        iVar14 = (iVar14 + 1) - (uint)(uVar2 < 0x10);
        if ((uVar2 & 0xc) == 0) {
          iVar15 = iVar15 + 1;
          puVar4[uVar13 >> 2] = uVar2 | 0xc;
          if (uVar2 >> 4 == (this->levels_).super_type.ebo_.size) {
            iVar12 = iVar12 + 1;
          }
          else {
            local_48.first.rep_ = pLVar5[uVar9].rep_ & 0xfffffffe ^ 2;
            bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                      (local_50,&local_48.first);
            pDVar1 = (this->levels_).super_type.ebo_.buf + ((uVar2 >> 4) - 1);
            *(uint *)pDVar1 = *(uint *)pDVar1 | 0x40000000;
          }
        }
        uVar13 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar13;
      } while (uVar13 != (this->conflict_).ebo_.size);
    }
    if (iVar15 != local_64) {
      local_78.data_ = 0;
    }
    plVar10 = local_38;
    if (iVar14 != iVar15) {
      local_70.data_ = 0;
      plVar10 = (long *)0x0;
    }
    if ((((ulong)local_40 & 0x6000000000) != 0) &&
       (plVar10 != (long *)0x0 || (long *)local_78.data_ != (long *)0x0)) {
      otfs(this,&local_78,&local_70,local_7c,iVar12 == 1);
    }
    pLVar5 = (this->assign_).trail.ebo_.buf;
    puVar4 = (this->assign_).assign_.ebo_.buf;
    local_7c.rep_ = pLVar5[(this->assign_).trail.ebo_.size - 1].rep_;
    uVar9 = (ulong)(local_7c.rep_ >> 2);
    if ((*(byte *)((long)puVar4 + (ulong)(local_7c.rep_ & 0xfffffffc)) & 0xc) == 0) {
      puVar6 = (this->assign_).assign_.ebo_.buf;
      do {
        puVar6[uVar9] = 0;
        sVar3 = (this->assign_).trail.ebo_.size;
        (this->assign_).trail.ebo_.size = sVar3 - 1;
        local_7c.rep_ = pLVar5[sVar3 - 2].rep_;
        uVar9 = (ulong)(local_7c.rep_ >> 2);
      } while ((*(byte *)((long)puVar4 + (ulong)(local_7c.rep_ & 0xfffffffc)) & 0xc) == 0);
    }
    pAVar7 = (this->assign_).reason_.super_type.ebo_.buf;
    plVar10 = (long *)pAVar7[uVar9].data_;
    *(byte *)(puVar4 + uVar9) = (byte)puVar4[uVar9] & 0xf3;
    iVar12 = iVar12 + -1;
    local_70.data_ = (uint64)plVar10;
    if (iVar12 == 0) break;
    iVar15 = iVar15 + -1;
    (this->conflict_).ebo_.size = 0;
    Antecedent::reason(pAVar7 + (local_7c.rep_ >> 2),this,local_7c,local_58);
    local_60 = plVar10;
  }
  ((this->cc_).ebo_.buf)->rep_ = local_7c.rep_ & 0xfffffffe ^ 2;
  if (((ulong)this->strategy_ & 0x4000000000) != 0 || (long *)local_78.data_ != (long *)0x0) {
    if ((long *)local_78.data_ == (long *)0x0) {
      if (((this->cc_).ebo_.size <= (this->conflict_).ebo_.size + 1) &&
         (AVar11.data_ = (uint64)local_60, ((ulong)local_60 & 3) == 0 && local_60 != (long *)0x0))
      goto LAB_0016b1c0;
    }
    else {
      AVar11.data_ = local_78.data_;
      if ((local_78.data_ & 3) == 0) {
LAB_0016b1c0:
        rhs_00 = (ClauseHead *)(**(code **)(*(long *)AVar11.data_ + 0x48))();
        goto LAB_0016b1ce;
      }
    }
  }
  rhs_00 = (ClauseHead *)0x0;
LAB_0016b1ce:
  if (((((this->strategy_).field_0x6 & 4) != 0) &&
      (plVar10 = (long *)(this->assign_).reason_.super_type.ebo_.buf[local_7c.rep_ >> 2].data_,
      ((ulong)plVar10 & 3) == 0 && plVar10 != (long *)0x0)) &&
     (iVar12 = (**(code **)(*plVar10 + 0x50))(), iVar12 != 0)) {
    uVar13 = (**(code **)(*(long *)(this->assign_).reason_.super_type.ebo_.buf[local_7c.rep_ >> 2].
                                   data_ + 0x60))();
    local_48.second = 0x7f;
    if ((uVar13 & 0x7f00000) != 0) {
      local_48.second = uVar13 >> 0x14 & 0x7f;
    }
    local_48.first.rep_ = local_7c.rep_;
    bk_lib::
    pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
    push_back(&this->bumpAct_,&local_48);
  }
  uVar8 = simplifyConflictClause(this,local_50,&this->ccInfo_,rhs_00);
  return uVar8;
}

Assistant:

uint32 Solver::analyzeConflict() {
	// must be called here, because we unassign vars during analyzeConflict
	heuristic_->undoUntil( *this, levels_.back().trailPos );
	uint32 onLevel  = 0;        // number of literals from the current DL in resolvent
	uint32 resSize  = 0;        // size of current resolvent
	Literal p;                  // literal to be resolved out next
	cc_.assign(1, p);           // will later be replaced with asserting literal
	Antecedent lhs, rhs, last;  // resolve operands
	const bool doOtfs = strategy_.otfs > 0;
	for (bumpAct_.clear();;) {
		uint32 lhsSize = resSize;
		uint32 rhsSize = 0;
		heuristic_->updateReason(*this, conflict_, p);
		for (LitVec::size_type i = 0; i != conflict_.size(); ++i) {
			Literal& q = conflict_[i];
			uint32 cl  = level(q.var());
			rhsSize   += (cl != 0);
			if (!seen(q.var())) {
				++resSize;
				assert(isTrue(q) && "Invalid literal in reason set!");
				assert(cl > 0 && "Top-Level implication not marked!");
				markSeen(q.var());
				if (cl == decisionLevel()) {
					++onLevel;
				}
				else {
					cc_.push_back(~q);
					markLevel(cl);
				}
			}
		}
		if (resSize != lhsSize) { lhs = 0; }
		if (rhsSize != resSize) { rhs = 0; }
		if (doOtfs && (!rhs.isNull() || !lhs.isNull())) {
			// resolvent subsumes rhs and possibly also lhs
			otfs(lhs, rhs, p, onLevel == 1);
		}
		assert(onLevel > 0 && "CONFLICT MUST BE ANALYZED ON CONFLICT LEVEL!");
		// search for the last assigned literal that needs to be analyzed...
		while (!seen(assign_.last().var())) {
			assign_.undoLast();
		}
		p   = assign_.last();
		rhs = reason(p);
		clearSeen(p.var());
		if (--onLevel == 0) {
			break;
		}
		--resSize; // p will be resolved out next
		last = rhs;
		reason(p, conflict_);
	}
	cc_[0] = ~p; // store the 1-UIP
	assert(decisionLevel() == level(cc_[0].var()));
	ClauseHead* lastRes = 0;
	if (strategy_.otfs > 1 || !lhs.isNull()) {
		if (!lhs.isNull()) {
			lastRes = clause(lhs);
		}
		else if (cc_.size() <= (conflict_.size()+1)) {
			lastRes = clause(last);
		}
	}
	if (strategy_.bumpVarAct && reason(p).learnt()) {
		bumpAct_.push_back(WeightLiteral(p, reason(p).constraint()->activity().lbd()));
	}
	return simplifyConflictClause(cc_, ccInfo_, lastRes);
}